

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

bool __thiscall
Memory::SegmentBase<Memory::VirtualAllocWrapper>::Initialize
          (SegmentBase<Memory::VirtualAllocWrapper> *this,DWORD allocFlags,bool excludeGuardPages)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  UINT_PTR UVar6;
  unsigned_long pageCount;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar7;
  VirtualAllocWrapper *pVVar8;
  char *pcVar9;
  size_t sVar10;
  undefined8 *in_FS_OFFSET;
  byte local_49;
  bool local_3a;
  bool registerBarrierResult;
  bool committed;
  size_t totalPages;
  uint randomNumber;
  bool addGuardPages;
  char *originalAddress;
  bool excludeGuardPages_local;
  DWORD allocFlags_local;
  SegmentBase<Memory::VirtualAllocWrapper> *this_local;
  
  if (this->address != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x58,"(this->address == nullptr)","this->address == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  totalPages._7_1_ = 0;
  if (!excludeGuardPages) {
    local_49 = 1;
    if (this->segmentPageCount << 0xc < 0x100001) {
      local_49 = Js::Configuration::Global[0x5f71];
    }
    totalPages._7_1_ = local_49 & 1;
    if (totalPages._7_1_ != 0) {
      UVar6 = Math::Rand();
      this->leadingGuardPageCount = (uint)UVar6 % 0xf + 1;
      this->trailingGuardPageCount = 1;
    }
  }
  sVar10 = this->segmentPageCount;
  uVar5 = this->leadingGuardPageCount;
  uVar1 = this->trailingGuardPageCount;
  uVar4 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
  pageCount = Math::Align<unsigned_long>(sVar10 + uVar5 + (ulong)uVar1,(ulong)uVar4);
  this->segmentPageCount = pageCount - (this->leadingGuardPageCount + this->trailingGuardPageCount);
  pPVar7 = GetAllocator(this);
  bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::RequestAlloc(pPVar7,pageCount << 0xc);
  if (bVar3) {
    pPVar7 = GetAllocator(this);
    pVVar8 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             ::GetVirtualAllocator(pPVar7);
    bVar3 = IsInCustomHeapAllocator(this);
    pcVar9 = (char *)VirtualAllocWrapper::AllocPages
                               (pVVar8,(LPVOID)0x0,pageCount,allocFlags | 0x2000,4,bVar3);
    this->address = pcVar9;
    if (this->address == (char *)0x0) {
      pPVar7 = GetAllocator(this);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ReportFailure(pPVar7,pageCount << 0xc);
      this_local._7_1_ = false;
    }
    else {
      if (((ulong)this->address & 0xffff) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x86,"(((ULONG_PTR)this->address % (64 * 1024)) == 0)",
                           "((ULONG_PTR)this->address % (64 * 1024)) == 0");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      pcVar9 = this->address;
      bVar3 = (allocFlags & 0x1000) != 0;
      if (totalPages._7_1_ != 0) {
        if ((Js::Configuration::Global[0x5f72] & 1) != 0) {
          Output::Print(L"Number of Leading Guard Pages: %d\n",(ulong)this->leadingGuardPageCount);
        }
        if ((Js::Configuration::Global[0x5f72] & 1) != 0) {
          Output::Print(L"Starting address of Leading Guard Pages: 0x%p\n",this->address);
        }
        if ((Js::Configuration::Global[0x5f72] & 1) != 0) {
          Output::Print(L"Offset of Segment Start address: 0x%p\n",
                        this->address + (this->leadingGuardPageCount << 0xc));
        }
        if ((Js::Configuration::Global[0x5f72] & 1) != 0) {
          Output::Print(L"Starting address of Trailing Guard Pages: 0x%p\n",
                        this->address +
                        ((ulong)this->leadingGuardPageCount + this->segmentPageCount) * 0x1000);
        }
        if (bVar3) {
          pPVar7 = GetAllocator(this);
          pVVar8 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   ::GetVirtualAllocator(pPVar7);
          VirtualAllocWrapper::Free
                    (pVVar8,this->address,(ulong)(this->leadingGuardPageCount << 0xc),0x4000);
          pPVar7 = GetAllocator(this);
          pVVar8 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   ::GetVirtualAllocator(pPVar7);
          VirtualAllocWrapper::Free
                    (pVVar8,this->address +
                            ((ulong)this->leadingGuardPageCount + this->segmentPageCount) * 0x1000,
                     (ulong)(this->trailingGuardPageCount << 0xc),0x4000);
        }
        pPVar7 = GetAllocator(this);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::ReportFree(pPVar7,(ulong)((this->leadingGuardPageCount + this->trailingGuardPageCount) *
                                   0x1000));
        this->address = this->address + (this->leadingGuardPageCount << 0xc);
      }
      pPVar7 = GetAllocator(this);
      uVar5 = (*pPVar7->_vptr_PageAllocatorBase[6])
                        (pPVar7,this,(ulong)bVar3,&this->secondaryAllocator);
      if ((uVar5 & 1) == 0) {
        pPVar7 = GetAllocator(this);
        pVVar8 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 ::GetVirtualAllocator(pPVar7);
        sVar10 = GetPageCount(this);
        VirtualAllocWrapper::Free(pVVar8,pcVar9,sVar10 << 0xc,0x8000);
        pPVar7 = GetAllocator(this);
        sVar10 = GetPageCount(this);
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::ReportFailure(pPVar7,sVar10 << 0xc);
        this->address = (char *)0x0;
        this_local._7_1_ = false;
      }
      else {
        local_3a = true;
        if ((Js::Configuration::Global[0x2c154] & 1) == 0) {
          local_3a = RecyclerWriteBarrierManager::OnSegmentAlloc
                               (this->address,this->segmentPageCount);
        }
        else if (((byte)this->field_0x2c >> 1 & 1) != 0) {
          local_3a = RecyclerWriteBarrierManager::OnSegmentAlloc
                               (this->address,this->segmentPageCount);
        }
        if (local_3a == false) {
          pPVar7 = GetAllocator(this);
          pVVar8 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   ::GetVirtualAllocator(pPVar7);
          sVar10 = GetPageCount(this);
          VirtualAllocWrapper::Free(pVVar8,pcVar9,sVar10 << 0xc,0x8000);
          pPVar7 = GetAllocator(this);
          sVar10 = GetPageCount(this);
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::ReportFailure(pPVar7,sVar10 << 0xc);
          this->address = (char *)0x0;
          this_local._7_1_ = false;
        }
        else {
          this->field_0x2c = this->field_0x2c & 0xfe | 1;
          if (((byte)this->field_0x2c >> 1 & 1) != 0) {
            RecyclerWriteBarrierManager::ToggleBarrier
                      (this->address,this->segmentPageCount << 0xc,true);
          }
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
SegmentBase<T>::Initialize(DWORD allocFlags, bool excludeGuardPages)
{
    Assert(this->address == nullptr);
    char* originalAddress = nullptr;
    bool addGuardPages = false;
    if (!excludeGuardPages)
    {
        addGuardPages = (this->segmentPageCount * AutoSystemInfo::PageSize) > VirtualAllocThreshold;
#if TARGET_32
        unsigned int randomNumber2 = static_cast<unsigned int>(Math::Rand());
        addGuardPages = addGuardPages && (randomNumber2 % 4 == 1);
#endif
#if DEBUG
        addGuardPages = addGuardPages || Js::Configuration::Global.flags.ForceGuardPages;
#endif
        if (addGuardPages)
        {
            unsigned int randomNumber = static_cast<unsigned int>(Math::Rand());
            this->leadingGuardPageCount = randomNumber % maxGuardPages + minGuardPages;
            this->trailingGuardPageCount = minGuardPages;
        }
    }

    // We can only allocate with this granularity using VirtualAlloc
    size_t totalPages = Math::Align<size_t>(this->segmentPageCount + leadingGuardPageCount + trailingGuardPageCount, AutoSystemInfo::Data.GetAllocationGranularityPageCount());
    this->segmentPageCount = totalPages - (leadingGuardPageCount + trailingGuardPageCount);

#ifdef FAULT_INJECTION
    if (Js::FaultInjection::Global.ShouldInjectFault(Js::FaultInjection::Global.NoThrow))
    {
        this->address = nullptr;
        return false;
    }
#endif

    if (!this->GetAllocator()->RequestAlloc(totalPages * AutoSystemInfo::PageSize))
    {
        return false;
    }

    this->address = (char *)GetAllocator()->GetVirtualAllocator()->AllocPages(NULL, totalPages, MEM_RESERVE | allocFlags, PAGE_READWRITE, this->IsInCustomHeapAllocator());

    if (this->address == nullptr)
    {
        this->GetAllocator()->ReportFailure(totalPages * AutoSystemInfo::PageSize);
        return false;
    }

    Assert( ((ULONG_PTR)this->address % (64 * 1024)) == 0 );

    originalAddress = this->address;
    bool committed = (allocFlags & MEM_COMMIT) != 0;
    if (addGuardPages)
    {
#if DBG_DUMP
        GUARD_PAGE_TRACE(_u("Number of Leading Guard Pages: %d\n"), leadingGuardPageCount);
        GUARD_PAGE_TRACE(_u("Starting address of Leading Guard Pages: 0x%p\n"), address);
        GUARD_PAGE_TRACE(_u("Offset of Segment Start address: 0x%p\n"), this->address + (leadingGuardPageCount*AutoSystemInfo::PageSize));
        GUARD_PAGE_TRACE(_u("Starting address of Trailing Guard Pages: 0x%p\n"), address + ((leadingGuardPageCount + this->segmentPageCount)*AutoSystemInfo::PageSize));
#endif
        if (committed)
        {
            GetAllocator()->GetVirtualAllocator()->Free(address,
              leadingGuardPageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);

            GetAllocator()->GetVirtualAllocator()->Free(address +
              ((leadingGuardPageCount + this->segmentPageCount) * AutoSystemInfo::PageSize),
              trailingGuardPageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        }
        this->GetAllocator()->ReportFree((leadingGuardPageCount + trailingGuardPageCount) * AutoSystemInfo::PageSize);

        this->address = this->address + (leadingGuardPageCount*AutoSystemInfo::PageSize);
    }

    if (!GetAllocator()->CreateSecondaryAllocator(this, committed, &this->secondaryAllocator))
    {
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress,
          GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        this->GetAllocator()->ReportFailure(GetPageCount() * AutoSystemInfo::PageSize);
        this->address = nullptr;
        return false;
    }

#ifdef RECYCLER_WRITE_BARRIER
#if defined(TARGET_64) && defined(RECYCLER_WRITE_BARRIER_BYTE)
    bool registerBarrierResult = true;
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (CONFIG_FLAG(StrictWriteBarrierCheck))
    {
        if (this->isWriteBarrierEnabled)
        {
            // only commit card table for write barrier pages for strict check
            // we can do this in free build if all write barrier annotated struct
            // only allocate with write barrier pages
            registerBarrierResult = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address, this->segmentPageCount);
        }
    }
    else
#endif
    {
        registerBarrierResult = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address, this->segmentPageCount);
    }

    if (!registerBarrierResult)
    {
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress,
          GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        this->GetAllocator()->ReportFailure(GetPageCount() * AutoSystemInfo::PageSize);
        this->address = nullptr;
        return false;
    }
#endif

    this->isWriteBarrierAllowed = true;
#if DBG

    if (this->isWriteBarrierEnabled)
    {
        RecyclerWriteBarrierManager::ToggleBarrier(this->address,
          this->segmentPageCount * AutoSystemInfo::PageSize, true);
    }
#endif
#endif

    return true;
}